

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomrestartmethod.cpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
randomRestartMethod::optimize
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,randomRestartMethod *this)

{
  backtrackingLineSearch *pbVar1;
  uint uVar2;
  ostream *poVar3;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> x_opt;
  vector<double,_std::allocator<double>_> x;
  uniform_real_distribution<double> local_27e8;
  _Vector_base<double,_std::allocator<double>_> local_27d8;
  string logFileName;
  string local_27a0;
  string local_2780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2760;
  random_device rd;
  mt19937 gen;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::random_device::random_device(&rd);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar2);
  local_27e8._M_param._M_a = this->from;
  local_27e8._M_param._M_b = this->to;
  uVar2 = 0;
  while( true ) {
    if (this->no_restarts < uVar2) break;
    logFileName._M_dataplus._M_p =
         (pointer)std::uniform_real_distribution<double>::operator()(&local_27e8,&gen);
    logFileName._M_string_length =
         (size_type)std::uniform_real_distribution<double>::operator()(&local_27e8,&gen);
    __l._M_len = 2;
    __l._M_array = (iterator)&logFileName;
    std::vector<double,_std::allocator<double>_>::vector(&x,__l,(allocator_type *)&local_2760);
    x_opt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    x_opt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    x_opt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if ((this->super_optimizer).verbose != 0) {
      std::__cxx11::to_string(&local_2780,uVar2);
      std::operator+(&local_2760,"../logs/solutionPath",&local_2780);
      std::operator+(&logFileName,&local_2760,".dat");
      std::__cxx11::string::~string((string *)&local_2760);
      std::__cxx11::string::~string((string *)&local_2780);
      pbVar1 = this->unconstraint_optimizer;
      std::__cxx11::string::string((string *)&local_27a0,(string *)&logFileName);
      optimizer::setLogFileName(&pbVar1->super_optimizer,&local_27a0);
      std::__cxx11::string::~string((string *)&local_27a0);
      optimizer::setVerbose
                (&this->unconstraint_optimizer->super_optimizer,(this->super_optimizer).verbose);
      std::__cxx11::string::~string((string *)&logFileName);
    }
    pbVar1 = this->unconstraint_optimizer;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_27d8,&x);
    backtrackingLineSearch::set_x0(pbVar1,(vector<double,_std::allocator<double>_> *)&local_27d8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_27d8);
    backtrackingLineSearch::optimize
              ((vector<double,_std::allocator<double>_> *)&logFileName,this->unconstraint_optimizer)
    ;
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&x_opt,&logFileName);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&logFileName);
    poVar3 = std::ostream::_M_insert<double>
                       (*x_opt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<double>
                       (x_opt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[1]);
    poVar3 = std::operator<<(poVar3," ");
    uVar2 = uVar2 + 1;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&x_opt.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&x.super__Vector_base<double,_std::allocator<double>_>);
  }
  if ((this->super_optimizer).verbose == 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Plotting the solutions");
    std::endl<char,std::char_traits<char>>(poVar3);
    system("gnuplot -p -e \'load \"../logs/solutionPath.plt\"\'");
  }
  std::random_device::~random_device(&rd);
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double>>  randomRestartMethod::optimize(){
    vector<vector<double>> opt_count;
    random_device rd;
    std::mt19937 gen(rd()); //Standard mersenne_twister_engine seeded with rd()
    std::uniform_real_distribution<> dis(from,to);

    for(uint i=0;i<=no_restarts;i++){
        vector<double> x={dis(gen),dis(gen)};
        vector<double> x_opt;
        if(verbose!=0){
            string logFileName="../logs/solutionPath"+to_string(i)+".dat";
            unconstraint_optimizer->setLogFileName(logFileName);
            unconstraint_optimizer->setVerbose(verbose);
        }
        unconstraint_optimizer->set_x0(x);
        x_opt=unconstraint_optimizer->optimize();
        cout<<x_opt[0]<<" "<<x_opt[1]<<" "<<(i+1)<<endl;
    }
    if (verbose == 2){
        std::cout<<"Plotting the solutions"<<std::endl;
        system("gnuplot -p -e 'load \"../logs/solutionPath.plt\"'");
    }
    return opt_count;
}